

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::
BinaryExpression<const_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_&,_(Catch::Internal::Operator)1,_const_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_&>
::endExpression(BinaryExpression<const_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_&,_(Catch::Internal::Operator)1,_const_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_&>
                *this)

{
  ResultBuilder *this_00;
  OfType OVar1;
  
  OVar1 = ExpressionFailed;
  if (this->m_lhs->_M_node != this->m_rhs->_M_node) {
    OVar1 = Ok;
  }
  this_00 = this->m_rb;
  (this_00->m_data).resultType = OVar1;
  ResultBuilder::endExpression(this_00,&this->super_DecomposedExpression);
  return;
}

Assistant:

void endExpression() const {
        m_rb
            .setResultType( Internal::compare<Op>( m_lhs, m_rhs ) )
            .endExpression( *this );
    }